

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

bool __thiscall
cmOrderDirectoriesConstraint::FileMayConflict
          (cmOrderDirectoriesConstraint *this,string *dir,string *name)

{
  bool bVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator cVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string file;
  string local_c0;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  
  local_68.first._M_str = (dir->_M_dataplus)._M_p;
  local_68.first._M_len = dir->_M_string_length;
  local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90 = local_88;
  local_a0 = 0;
  local_98 = 1;
  local_88[0] = 0x2f;
  local_50 = 1;
  local_40 = 0;
  local_30 = (name->_M_dataplus)._M_p;
  local_38 = name->_M_string_length;
  local_28 = 0;
  views._M_len = 3;
  views._M_array = &local_68;
  local_48 = local_90;
  cmCatViews(&local_c0,views);
  bVar1 = cmsys::SystemTools::FileExists(&local_c0,true);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::SameFile(&this->FullPath,&local_c0);
    bVar1 = !bVar1;
  }
  else {
    this_00 = &cmGlobalGenerator::GetDirectoryContent(this->GlobalGenerator,dir,false)->_M_t;
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(this_00,name);
    bVar1 = (_Rb_tree_header *)cVar2._M_node != &(this_00->_M_impl).super__Rb_tree_header;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmOrderDirectoriesConstraint::FileMayConflict(std::string const& dir,
                                                   std::string const& name)
{
  // Check if the file exists on disk.
  std::string file = cmStrCat(dir, '/', name);
  if (cmSystemTools::FileExists(file, true)) {
    // The file conflicts only if it is not the same as the original
    // file due to a symlink or hardlink.
    return !cmSystemTools::SameFile(this->FullPath, file);
  }

  // Check if the file will be built by cmake.
  std::set<std::string> const& files =
    (this->GlobalGenerator->GetDirectoryContent(dir, false));
  auto fi = files.find(name);
  return fi != files.end();
}